

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

callbacks __thiscall
pstore::exchange::import_ns::callbacks::
make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
          (callbacks *this,not_null<pstore::database_*> db,
          transaction<std::unique_lock<mock_mutex>_> *args,string_mapping *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  callbacks cVar1;
  element_type *local_50;
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
  local_48;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_40;
  undefined1 local_38 [8];
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  string_mapping *args_local_1;
  transaction<std::unique_lock<mock_mutex>_> *args_local;
  not_null<pstore::database_*> db_local;
  
  ctxt.super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_1;
  args_local_1 = (string_mapping *)args;
  args_local = (transaction<std::unique_lock<mock_mutex>_> *)db.ptr_;
  db_local.ptr_ = (database *)this;
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)local_38);
  local_50 = std::__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>::
             get((__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2> *)
                 local_38);
  std::
  make_unique<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::exchange::import_ns::context*,pstore::transaction<std::unique_lock<mock_mutex>>*&,pstore::exchange::import_ns::string_mapping*&>
            ((context **)&local_48,(transaction<std::unique_lock<mock_mutex>_> **)&local_50,
             &args_local_1);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_40,&local_48);
  callbacks(this,(shared_ptr<pstore::exchange::import_ns::context> *)local_38,&local_40);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_40);
  std::
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,_pstore::transaction<std::unique_lock<mock_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
  ::~unique_ptr(&local_48);
  std::shared_ptr<pstore::exchange::import_ns::context>::~shared_ptr
            ((shared_ptr<pstore::exchange::import_ns::context> *)local_38);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }